

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void uv_sleep(uint msec)

{
  int iVar1;
  int *piVar2;
  timespec timeout;
  timespec local_20;
  
  local_20.tv_sec = (ulong)msec / 1000;
  local_20.tv_nsec = (long)((msec % 1000) * 1000000);
  do {
    iVar1 = nanosleep(&local_20,&local_20);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("rc == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/core.c"
                ,0x5ee,"void uv_sleep(unsigned int)");
}

Assistant:

void uv_sleep(unsigned int msec) {
  struct timespec timeout;
  int rc;

  timeout.tv_sec = msec / 1000;
  timeout.tv_nsec = (msec % 1000) * 1000 * 1000;

  do
    rc = nanosleep(&timeout, &timeout);
  while (rc == -1 && errno == EINTR);

  assert(rc == 0);
}